

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_char(PrintfArgFormatter<wchar_t> *this,int value)

{
  BasicWriter<wchar_t> *this_00;
  FormatSpec *pFVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  this_00 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
            writer_;
  pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).spec_
  ;
  if ((pFVar1->type_ != '\0') && (pFVar1->type_ != 'c')) {
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>(this_00,value,*pFVar1);
  }
  uVar11 = (ulong)(pFVar1->super_AlignSpec).super_WidthSpec.width_;
  if (uVar11 < 2) {
    puVar2 = *(undefined8 **)(this_00 + 8);
    lVar8 = puVar2[2];
    uVar11 = lVar8 + 1;
    if ((ulong)puVar2[3] < uVar11) {
      (**(code **)*puVar2)(puVar2,uVar11);
    }
    puVar2[2] = uVar11;
    piVar10 = (int *)(lVar8 * 4 + *(long *)(*(long *)(this_00 + 8) + 8));
  }
  else {
    puVar2 = *(undefined8 **)(this_00 + 8);
    lVar8 = puVar2[2];
    uVar11 = uVar11 + lVar8;
    if ((ulong)puVar2[3] < uVar11) {
      (**(code **)*puVar2)(puVar2,uVar11);
    }
    puVar2[2] = uVar11;
    auVar6 = _DAT_00112740;
    auVar5 = _DAT_00112730;
    auVar4 = _DAT_00112720;
    lVar3 = *(long *)(*(long *)(this_00 + 8) + 8);
    piVar10 = (int *)(lVar3 + lVar8 * 4);
    uVar7 = (pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1;
    if ((pFVar1->super_AlignSpec).align_ == ALIGN_LEFT) {
      if (uVar7 != 0) {
        uVar11 = (ulong)uVar7 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar12._8_4_ = (int)uVar11;
        auVar12._0_8_ = uVar11;
        auVar12._12_4_ = (int)(uVar11 >> 0x20);
        lVar3 = lVar3 + lVar8 * 4;
        lVar8 = 0;
        auVar12 = auVar12 ^ _DAT_00112740;
        do {
          auVar14._8_4_ = (int)lVar8;
          auVar14._0_8_ = lVar8;
          auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar16 = (auVar14 | auVar5) ^ auVar6;
          iVar13 = auVar12._4_4_;
          if ((bool)(~(auVar16._4_4_ == iVar13 && auVar12._0_4_ < auVar16._0_4_ ||
                      iVar13 < auVar16._4_4_) & 1)) {
            *(undefined4 *)(lVar3 + 4 + lVar8 * 4) = 0x20;
          }
          if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
              auVar16._12_4_ <= auVar12._12_4_) {
            *(undefined4 *)(lVar3 + 8 + lVar8 * 4) = 0x20;
          }
          auVar16 = (auVar14 | auVar4) ^ auVar6;
          iVar17 = auVar16._4_4_;
          if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar16._0_4_ <= auVar12._0_4_)) {
            *(undefined4 *)(lVar3 + 0xc + lVar8 * 4) = 0x20;
            *(undefined4 *)(lVar3 + 0x10 + lVar8 * 4) = 0x20;
          }
          lVar8 = lVar8 + 4;
        } while ((uVar11 - ((uint)((ulong)uVar7 + 0x3fffffffffffffff) & 3)) + 4 != lVar8);
      }
    }
    else {
      if (uVar7 != 0) {
        uVar11 = (ulong)uVar7 + 0x3fffffffffffffff;
        uVar9 = uVar11 & 0x3fffffffffffffff;
        auVar16._8_4_ = (int)uVar9;
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = (int)(uVar9 >> 0x20);
        lVar3 = lVar3 + lVar8 * 4;
        lVar8 = 0;
        auVar16 = auVar16 ^ _DAT_00112740;
        do {
          auVar15._8_4_ = (int)lVar8;
          auVar15._0_8_ = lVar8;
          auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar12 = (auVar15 | auVar5) ^ auVar6;
          iVar13 = auVar16._4_4_;
          if ((bool)(~(auVar12._4_4_ == iVar13 && auVar16._0_4_ < auVar12._0_4_ ||
                      iVar13 < auVar12._4_4_) & 1)) {
            *(undefined4 *)(lVar3 + lVar8 * 4) = 0x20;
          }
          if ((auVar12._12_4_ != auVar16._12_4_ || auVar12._8_4_ <= auVar16._8_4_) &&
              auVar12._12_4_ <= auVar16._12_4_) {
            *(undefined4 *)(lVar3 + 4 + lVar8 * 4) = 0x20;
          }
          auVar15 = (auVar15 | auVar4) ^ auVar6;
          iVar17 = auVar15._4_4_;
          if (iVar17 <= iVar13 && (iVar17 != iVar13 || auVar15._0_4_ <= auVar16._0_4_)) {
            *(undefined4 *)(lVar3 + 8 + lVar8 * 4) = 0x20;
            *(undefined4 *)(lVar3 + 0xc + lVar8 * 4) = 0x20;
          }
          lVar8 = lVar8 + 4;
        } while ((uVar9 - ((uint)uVar11 & 3)) + 4 != lVar8);
      }
      piVar10 = piVar10 + uVar7;
    }
  }
  *piVar10 = value;
  return;
}

Assistant:

void visit_char(int value) {
    const FormatSpec &fmt_spec = this->spec();
    BasicWriter<Char> &w = this->writer();
    if (fmt_spec.type_ && fmt_spec.type_ != 'c')
      w.write_int(value, fmt_spec);
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    CharPtr out = CharPtr();
    if (fmt_spec.width_ > 1) {
      Char fill = ' ';
      out = w.grow_buffer(fmt_spec.width_);
      if (fmt_spec.align_ != ALIGN_LEFT) {
        std::fill_n(out, fmt_spec.width_ - 1, fill);
        out += fmt_spec.width_ - 1;
      } else {
        std::fill_n(out + 1, fmt_spec.width_ - 1, fill);
      }
    } else {
      out = w.grow_buffer(1);
    }
    *out = static_cast<Char>(value);
  }